

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t pax_attribute_SUN_holesdata
                  (archive_read *a,tar *tar,archive_entry *entry,char *p,size_t length)

{
  archive_entry *p_00;
  char cVar1;
  bool bVar2;
  archive **ppaVar3;
  archive_entry *paVar4;
  wchar_t wVar5;
  int64_t iVar6;
  char *pcVar7;
  long offset;
  uint local_3c;
  
  if ((p != (char *)0x0) && (*(char *)&entry->archive == ' ')) {
    local_3c = 1;
    offset = 0;
    do {
      p_00 = (archive_entry *)((long)&entry->archive + 1);
      pcVar7 = p + -1;
      if (pcVar7 == (char *)0x0) {
        bVar2 = true;
        paVar4 = p_00;
      }
      else {
        ppaVar3 = &entry->archive;
        entry = p_00;
        do {
          cVar1 = *(char *)&entry->archive;
          bVar2 = cVar1 != ' ';
          if (cVar1 == ' ') goto LAB_00138ff2;
          if ((byte)(cVar1 - 0x3aU) < 0xf6) {
            return L'\xffffffec';
          }
          entry = (archive_entry *)((long)&entry->archive + 1);
          pcVar7 = pcVar7 + -1;
          paVar4 = (archive_entry *)(p + (long)ppaVar3);
        } while (pcVar7 != (char *)0x0);
      }
      entry = paVar4;
      pcVar7 = (char *)0x0;
LAB_00138ff2:
      iVar6 = tar_atol_base_n((char *)p_00,(long)entry - (long)p_00,L'\n');
      if (iVar6 < 0) {
        return L'\xffffffec';
      }
      if (iVar6 - offset != 0 && offset <= iVar6) {
        wVar5 = gnu_add_sparse_entry(a,tar,offset,iVar6 - offset);
        if (wVar5 != L'\0') {
          return L'\xffffffe2';
        }
        tar->sparse_last->hole = local_3c;
      }
      if (bVar2) {
        if (*(char *)&entry->archive != '\n') {
          return L'\xffffffec';
        }
        return L'\0';
      }
      local_3c = local_3c ^ 1;
      p = pcVar7;
      offset = iVar6;
    } while (*(char *)&entry->archive != '\n');
  }
  return L'\xffffffec';
}

Assistant:

static int
pax_attribute_SUN_holesdata(struct archive_read *a, struct tar *tar,
	struct archive_entry *entry, const char *p, size_t length)
{
	const char *e;
	int64_t start, end;
	int hole = 1;

	(void)entry; /* UNUSED */

	end = 0;
	if (length <= 0)
		return (ARCHIVE_WARN);
	if (*p == ' ') {
		p++;
		length--;
	} else {
		return (ARCHIVE_WARN);
	}
	for (;;) {
		e = p;
		while (length > 0 && *e != ' ') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
			length--;
		}
		start = end;
		end = tar_atol10(p, e - p);
		if (end < 0)
			return (ARCHIVE_WARN);
		if (start < end) {
			if (gnu_add_sparse_entry(a, tar, start,
			    end - start) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			tar->sparse_last->hole = hole;
		}
		if (length == 0 || *e == '\n') {
			if (length == 0 && *e == '\n') {
				return (ARCHIVE_OK);
			} else {
				return (ARCHIVE_WARN);
			}
		}
		p = e + 1;
		length--;
		hole = hole == 0;
	}
}